

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fail_function.hpp
# Opt level: O3

bool __thiscall
boost::spirit::karma::detail::
fail_function<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type>
::operator()(fail_function<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type>
             *this,action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<16>,_(boost::spirit::endian::endianness)0,_16>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::argument<0>_>,_0L>,_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<unsigned_short>_>,_0L>_>_>,_2L>_>_>
                   *component)

{
  output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>
  *this_00;
  long lVar1;
  endian<(boost::spirit::endian::endianness)0,_unsigned_short,_16UL,_(boost::spirit::endian::alignment)0>
  p;
  uchar local_12 [2];
  
  this_00 = *(output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>
              **)this;
  lVar1 = 0;
  do {
    output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>
    ::operator=(this_00,local_12 + lVar1);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 2);
  return false;
}

Assistant:

bool operator()(Component const& component) const
        {
#if BOOST_WORKAROUND(BOOST_MSVC, BOOST_TESTED_AT(1600))  
            component; // suppresses warning: C4100: 'component' : unreferenced formal parameter
#endif
            // return true if any of the generators fail
            return !component.generate(sink, ctx, delim, unused);
        }